

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy-stubs-internal.h
# Opt level: O1

bool duckdb_snappy::GetUncompressedLength(char *start,size_t n,size_t *result)

{
  uint uVar1;
  uchar *ptr;
  uint uVar2;
  bool bVar3;
  
  if ((long)n < 1) {
    bVar3 = false;
    uVar1 = 0;
    goto LAB_002e4e96;
  }
  uVar2 = (byte)*start & 0x7f;
  if (*start < '\0') {
    bVar3 = false;
    uVar1 = 0;
    if (n == 1) goto LAB_002e4e96;
    uVar2 = ((byte)start[1] & 0x7f) << 7 | uVar2;
    if (start[1] < '\0') {
      bVar3 = false;
      uVar1 = 0;
      if ((long)n < 3) goto LAB_002e4e96;
      uVar2 = ((byte)start[2] & 0x7f) << 0xe | uVar2;
      if (start[2] < '\0') {
        bVar3 = false;
        uVar1 = 0;
        if (n == 3) goto LAB_002e4e96;
        uVar2 = ((byte)start[3] & 0x7f) << 0x15 | uVar2;
        if (start[3] < '\0') {
          bVar3 = false;
          uVar1 = 0;
          if (4 < (long)n) {
            bVar3 = (byte)start[4] < 0x10;
            uVar1 = 0;
            if (bVar3) {
              uVar1 = (uint)(byte)start[4] << 0x1c | uVar2;
            }
          }
          goto LAB_002e4e96;
        }
      }
    }
  }
  bVar3 = true;
  uVar1 = uVar2;
LAB_002e4e96:
  if (bVar3 != false) {
    *result = (ulong)uVar1;
  }
  return bVar3;
}

Assistant:

inline const char* Varint::Parse32WithLimit(const char* p,
                                            const char* l,
                                            uint32_t* OUTPUT) {
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  const unsigned char* limit = reinterpret_cast<const unsigned char*>(l);
  uint32_t b, result;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result = b & 127;          if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) <<  7; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 14; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 21; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 28; if (b < 16) goto done;
  return NULL;       // Value is too long to be a varint32
 done:
  *OUTPUT = result;
  return reinterpret_cast<const char*>(ptr);
}